

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  int params;
  void *params_1;
  long lVar2;
  bool bVar3;
  undefined1 local_3f8 [8];
  MyPlugin p0;
  MyPlugin1 p1;
  
  local_3f8 = (undefined1  [8])&PTR__signal_0010c940;
  p0.sig0._8_8_ =
       &p0.sig0.m_funcs.
        super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void>_>,_int>,_void,_void>
        .super_type.m_holder.m_capacity;
  p0.sig0.m_funcs.
  super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void>_>,_int>,_void,_void>
  .super_type.m_holder.m_start = (pointer)0x0;
  p0.sig0.m_funcs.
  super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void>_>,_int>,_void,_void>
  .super_type.m_holder.m_size = 0x10;
  p0.sig0.super_signal_base._vptr_signal_base._0_4_ = 0;
  p0.sig0.super_signal_base._vptr_signal_base._4_4_ = 0;
  p0.sig0.m_funcs.super_type.m_rest_of_storage[0xe]._8_8_ = &PTR__signal_0010c990;
  p0.sig1._8_8_ =
       &p0.sig1.m_funcs.
        super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int>_>,_int>,_void,_void>
        .super_type.m_holder.m_capacity;
  p0.sig1.m_funcs.
  super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int>_>,_int>,_void,_void>
  .super_type.m_holder.m_start = (pointer)0x0;
  p0.sig1.m_funcs.
  super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int>_>,_int>,_void,_void>
  .super_type.m_holder.m_size = 0x10;
  p0.sig1.super_signal_base._vptr_signal_base._0_4_ = 0;
  p0.sig1.super_signal_base._vptr_signal_base._4_4_ = 0;
  p0.sig1.m_funcs.super_type.m_rest_of_storage[0xe]._8_8_ = &PTR__signal_0010c9d0;
  p0.sig2._8_8_ =
       &p0.sig2.m_funcs.
        super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_void,_void>
        .super_type.m_holder.m_capacity;
  p0.sig2.m_funcs.
  super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_void,_void>
  .super_type.m_holder.m_start = (pointer)0x0;
  p0.sig2.m_funcs.
  super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_void,_void>
  .super_type.m_holder.m_size = 0x10;
  p0.sig2.super_signal_base._vptr_signal_base = (_func_int **)0x0;
  MyPlugin1::init((MyPlugin1 *)((long)p0.sig2.m_funcs.super_type.m_rest_of_storage + 0xe8),
                  (EVP_PKEY_CTX *)local_3f8);
  if (argc == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Testing fast signals",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    lVar2 = 100000000;
    params_1 = (void *)0x0;
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      sigc::signal<void>::emit((signal<void> *)local_3f8);
      params = (int)params_1;
      sigc::signal<void,_int>::emit
                ((signal<void,_int> *)((long)p0.sig0.m_funcs.super_type.m_rest_of_storage + 0xe8),
                 params);
      params_1 = (void *)((long)params_1 + 1);
      sigc::signal<void,_int,_void_*>::emit
                ((signal<void,_int,_void_*> *)
                 ((long)p0.sig1.m_funcs.super_type.m_rest_of_storage + 0xe8),params,params_1);
    }
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  MyPlugin1::~MyPlugin1((MyPlugin1 *)((long)p0.sig2.m_funcs.super_type.m_rest_of_storage + 0xe8));
  p0.sig1.m_funcs.super_type.m_rest_of_storage[0xe]._8_8_ = &PTR__signal_0010c9d0;
  boost::container::
  vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::small_vector_allocator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::new_allocator<void>,_void>,_void>
  ::~vector((vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::small_vector_allocator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_boost::container::new_allocator<void>,_void>,_void>
             *)&p0.sig2.m_activeSignals);
  p0.sig0.m_funcs.super_type.m_rest_of_storage[0xe]._8_8_ = &PTR__signal_0010c990;
  boost::container::
  vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int>_>,_int>,_boost::container::small_vector_allocator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int>_>,_int>,_boost::container::new_allocator<void>,_void>,_void>
  ::~vector((vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int>_>,_int>,_boost::container::small_vector_allocator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int>_>,_int>,_boost::container::new_allocator<void>,_void>,_void>
             *)&p0.sig1.m_activeSignals);
  local_3f8 = (undefined1  [8])&PTR__signal_0010c940;
  boost::container::
  vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void>_>,_int>,_boost::container::small_vector_allocator<std::pair<boost::intrusive_ptr<sigc::functor_base<void>_>,_int>,_boost::container::new_allocator<void>,_void>,_void>
  ::~vector((vector<std::pair<boost::intrusive_ptr<sigc::functor_base<void>_>,_int>,_boost::container::small_vector_allocator<std::pair<boost::intrusive_ptr<sigc::functor_base<void>_>,_int>,_boost::container::new_allocator<void>,_void>,_void>
             *)&p0.sig0.m_activeSignals);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    MyPlugin p0;
    MyPlugin1 p1;
    p1.init(&p0);

    if (argc == 1) {
        std::cout << "Testing fast signals" << std::endl;
        for (unsigned i = 0; i < 100000000; ++i) {
            p0.sig0.emit();
            p0.sig1.emit(i);
            p0.sig2.emit(i, (char *) (uintptr_t)(i + 1));
        }
    }

    std::cout << p1.m_counter << std::endl;
}